

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# witness.h
# Opt level: O0

void witness_assert_depth_to_rank
               (witness_tsdn_t *witness_tsdn,witness_rank_t rank_inclusive,uint depth)

{
  witness_t *w;
  witness_list_t *witnesses;
  uint d;
  witness_tsd_t *witness_tsd;
  uint depth_local;
  witness_rank_t rank_inclusive_local;
  witness_tsdn_t *witness_tsdn_local;
  
  return;
}

Assistant:

static inline void
witness_assert_depth_to_rank(witness_tsdn_t *witness_tsdn,
    witness_rank_t rank_inclusive, unsigned depth) {
	witness_tsd_t *witness_tsd;
	unsigned d;
	witness_list_t *witnesses;
	witness_t *w;

	if (!config_debug) {
		return;
	}

	if (witness_tsdn_null(witness_tsdn)) {
		return;
	}
	witness_tsd = witness_tsdn_tsd(witness_tsdn);

	d = 0;
	witnesses = &witness_tsd->witnesses;
	w = ql_last(witnesses, link);
	if (w != NULL) {
		ql_reverse_foreach(w, witnesses, link) {
			if (w->rank < rank_inclusive) {
				break;
			}
			d++;
		}
	}
	if (d != depth) {
		witness_depth_error(witnesses, rank_inclusive, depth);
	}
}